

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void MirrorUVRow_SSSE3(uint8_t *src_uv,uint8_t *dst_uv,int width)

{
  bool bVar1;
  uvec8 auVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  auVar2 = libyuv::kShuffleMirrorUV;
  lVar3 = (long)width;
  do {
    auVar5 = pshufb(*(undefined1 (*) [16])(src_uv + lVar3 * 2 + -0x10),(undefined1  [16])auVar2);
    *(undefined1 (*) [16])dst_uv = auVar5;
    dst_uv = (uint8_t *)((long)dst_uv + 0x10);
    lVar4 = lVar3 + -8;
    bVar1 = 7 < lVar3;
    lVar3 = lVar4;
  } while (lVar4 != 0 && bVar1);
  return;
}

Assistant:

void MirrorUVRow_SSSE3(const uint8_t* src_uv, uint8_t* dst_uv, int width) {
  intptr_t temp_width = (intptr_t)(width);
  asm volatile(

      "movdqa      %3,%%xmm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      -0x10(%0,%2,2),%%xmm0         \n"
      "pshufb      %%xmm5,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_uv),          // %0
        "+r"(dst_uv),          // %1
        "+r"(temp_width)       // %2
      : "m"(kShuffleMirrorUV)  // %3
      : "memory", "cc", "xmm0", "xmm5");
}